

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall glu::sl::ShaderParser::parseGLSLVersion(ShaderParser *this,GLSLVersion *version)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  GLSLVersion GVar3;
  allocator<char> local_61;
  string postfix;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postfix,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_40);
  GVar3 = GLSL_VERSION_130;
  assumeToken(this,TOKEN_INT_LITERAL);
  iVar2 = atoi((this->m_curTokenStr)._M_dataplus._M_p);
  advanceToken(this);
  if (this->m_curToken == TOKEN_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)&postfix);
    advanceToken(this);
  }
  if (iVar2 == 0x1c2) {
    GVar3 = GLSL_VERSION_450;
  }
  else if (iVar2 != 0x82) {
    if (iVar2 == 0x8c) {
      GVar3 = GLSL_VERSION_140;
    }
    else if (iVar2 == 0x96) {
      GVar3 = GLSL_VERSION_150;
    }
    else if (iVar2 == 300) {
      bVar1 = std::operator==(&postfix,"es");
      if (!bVar1) goto LAB_01590f04;
      GVar3 = GLSL_VERSION_300_ES;
    }
    else if (iVar2 == 0x136) {
      bVar1 = std::operator==(&postfix,"es");
      if (!bVar1) goto LAB_01590f04;
      GVar3 = GLSL_VERSION_310_ES;
    }
    else if (iVar2 == 0x140) {
      bVar1 = std::operator==(&postfix,"es");
      if (!bVar1) goto LAB_01590f04;
      GVar3 = GLSL_VERSION_320_ES;
    }
    else if (iVar2 == 0x14a) {
      GVar3 = GLSL_VERSION_330;
    }
    else if (iVar2 == 400) {
      GVar3 = GLSL_VERSION_400;
    }
    else if (iVar2 == 0x19a) {
      GVar3 = GLSL_VERSION_410;
    }
    else if (iVar2 == 0x1a4) {
      GVar3 = GLSL_VERSION_420;
    }
    else if (iVar2 == 0x1ae) {
      GVar3 = GLSL_VERSION_430;
    }
    else {
      if (iVar2 != 0x1b8) {
        if (iVar2 == 100) {
          bVar1 = std::operator==(&postfix,"es");
          GVar3 = GLSL_VERSION_100_ES;
          if (bVar1) goto LAB_01590eed;
        }
LAB_01590f04:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Unknown GLSL version",&local_61);
        parseError(this,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&postfix);
        _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
      }
      GVar3 = GLSL_VERSION_440;
    }
  }
LAB_01590eed:
  *version = GVar3;
  std::__cxx11::string::~string((string *)&postfix);
  return;
}

Assistant:

void ShaderParser::parseGLSLVersion (glu::GLSLVersion& version)
{
	int			versionNum		= 0;
	std::string	postfix			= "";

	assumeToken(TOKEN_INT_LITERAL);
	versionNum = parseIntLiteral(m_curTokenStr.c_str());
	advanceToken();

	if (m_curToken == TOKEN_IDENTIFIER)
	{
		postfix = m_curTokenStr;
		advanceToken();
	}

	DE_STATIC_ASSERT(glu::GLSL_VERSION_LAST == 14);

	if		(versionNum == 100 && postfix == "es")	version = glu::GLSL_VERSION_100_ES;
	else if (versionNum == 300 && postfix == "es")	version = glu::GLSL_VERSION_300_ES;
	else if (versionNum == 310 && postfix == "es")	version = glu::GLSL_VERSION_310_ES;
	else if (versionNum == 320 && postfix == "es")	version = glu::GLSL_VERSION_320_ES;
	else if (versionNum == 130)						version = glu::GLSL_VERSION_130;
	else if (versionNum == 140)						version = glu::GLSL_VERSION_140;
	else if (versionNum == 150)						version = glu::GLSL_VERSION_150;
	else if (versionNum == 330)						version = glu::GLSL_VERSION_330;
	else if (versionNum == 400)						version = glu::GLSL_VERSION_400;
	else if (versionNum == 410)						version = glu::GLSL_VERSION_410;
	else if (versionNum == 420)						version = glu::GLSL_VERSION_420;
	else if (versionNum == 430)						version = glu::GLSL_VERSION_430;
	else if (versionNum == 440)						version = glu::GLSL_VERSION_440;
	else if (versionNum == 450)						version = glu::GLSL_VERSION_450;
	else
		parseError("Unknown GLSL version");
}